

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssignToMatrixSwizzle
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  ulong uVar1;
  TIntermediate *pTVar2;
  TIntermediate *pTVar3;
  int iVar4;
  TOperator TVar5;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  TIntermTyped *base;
  undefined4 extraout_var_02;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_type sVar7;
  TVariable *variable;
  undefined4 extraout_var_05;
  TIntermConstantUnion *pTVar8;
  TIntermTyped *pTVar9;
  const_reference ppTVar10;
  undefined4 extraout_var_06;
  TConstUnionArray *pTVar11;
  TIntermTyped *pTVar12;
  undefined4 extraout_var_07;
  bool bVar13;
  TIntermTyped *leftComp;
  TIntermTyped *rightComp;
  undefined1 local_2b8 [4];
  int i;
  TType indexType;
  TType componentType;
  TType columnType;
  TIntermAggregate *result;
  TType vectorType;
  TIntermTyped *vectorAssign;
  TIntermSymbol *vector;
  TIntermSequence *swizzle;
  TIntermTyped *matrix;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])();
  bVar13 = false;
  if (CONCAT44(extraout_var,iVar4) != 0) {
    iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])();
    TVar5 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_00,iVar4));
    bVar13 = TVar5 == EOpMatrixSwizzle;
  }
  if (!bVar13) {
    __assert_fail("left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0xca4,
                  "TIntermTyped *glslang::HlslParseContext::handleAssignToMatrixSwizzle(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
                 );
  }
  if (op != EOpAssign) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only simple assignment to non-simple matrix swizzle is supported","assign",
               "");
  }
  iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 400))();
  base = (TIntermTyped *)(**(code **)(*plVar6 + 0x18))();
  iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x198))();
  plVar6 = (long *)(**(code **)(*plVar6 + 0x30))();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (**(code **)(*plVar6 + 400))();
  iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])();
  vectorAssign = (TIntermTyped *)CONCAT44(extraout_var_03,iVar4);
  vectorType.spirvType = (TSpirvType *)0x0;
  if (vectorAssign == (TIntermTyped *)0x0) {
    t = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar1 = *(ulong *)(CONCAT44(extraout_var_04,iVar4) + 8);
    sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00);
    TType::TType((TType *)&result,t,EvqTemporary,(TPrecisionQualifier)(uVar1 >> 0x19) & 7,
                 (int)((long)((ulong)(uint)((int)sVar7 >> 0x1f) << 0x20 | sVar7 & 0xffffffff) / 2),0
                 ,0,false);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    variable = makeInternalVariable(this,"intermVec",(TType *)&result);
    vectorAssign = &TIntermediate::addSymbol(pTVar2,variable,loc)->super_TIntermTyped;
    vectorType.spirvType = (TSpirvType *)handleAssign(this,loc,op,vectorAssign,right);
    TType::~TType((TType *)&result);
  }
  columnType.spirvType =
       (TSpirvType *)
       TIntermediate::makeAggregate
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                  (TIntermNode *)vectorType.spirvType);
  iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  TType::TType((TType *)&componentType.spirvType,(TType *)CONCAT44(extraout_var_05,iVar4),0,false);
  TType::TType((TType *)&indexType.spirvType,(TType *)&componentType.spirvType,0,false);
  TType::TType((TType *)local_2b8,EbtInt,EvqTemporary,1,0,0,false);
  rightComp._4_4_ = 0;
  while( true ) {
    sVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(this_00);
    if ((int)sVar7 <= rightComp._4_4_) break;
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar8 = TIntermediate::addConstantUnion
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        rightComp._4_4_ / 2,loc,false);
    pTVar9 = TIntermediate::addIndex
                       (pTVar2,EOpIndexDirect,vectorAssign,&pTVar8->super_TIntermTyped,loc);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                         (this_00,(long)rightComp._4_4_);
    iVar4 = (*(*ppTVar10)->_vptr_TIntermNode[5])();
    pTVar11 = TIntermConstantUnion::getConstArray
                        ((TIntermConstantUnion *)CONCAT44(extraout_var_06,iVar4));
    pTVar8 = TIntermediate::addConstantUnion(pTVar3,pTVar11,(TType *)local_2b8,loc,false);
    pTVar12 = TIntermediate::addIndex(pTVar2,EOpIndexDirect,base,&pTVar8->super_TIntermTyped,loc);
    (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&componentType.spirvType);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    ppTVar10 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                         (this_00,(long)(rightComp._4_4_ + 1));
    iVar4 = (*(*ppTVar10)->_vptr_TIntermNode[5])();
    pTVar11 = TIntermConstantUnion::getConstArray
                        ((TIntermConstantUnion *)CONCAT44(extraout_var_07,iVar4));
    pTVar8 = TIntermediate::addConstantUnion(pTVar3,pTVar11,(TType *)local_2b8,loc,false);
    pTVar12 = TIntermediate::addIndex(pTVar2,EOpIndexDirect,pTVar12,&pTVar8->super_TIntermTyped,loc)
    ;
    (*(pTVar12->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar12,&indexType.spirvType);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar9 = TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,pTVar12
                        ,pTVar9,loc);
    columnType.spirvType =
         (TSpirvType *)
         TIntermediate::growAggregate
                   (pTVar2,(TIntermNode *)columnType.spirvType,&pTVar9->super_TIntermNode);
    rightComp._4_4_ = rightComp._4_4_ + 2;
  }
  TIntermOperator::setOp((TIntermOperator *)columnType.spirvType,EOpSequence);
  TType::~TType((TType *)local_2b8);
  TType::~TType((TType *)&indexType.spirvType);
  TType::~TType((TType *)&componentType.spirvType);
  return (TIntermTyped *)columnType.spirvType;
}

Assistant:

TIntermTyped* HlslParseContext::handleAssignToMatrixSwizzle(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                                            TIntermTyped* right)
{
    assert(left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle);

    if (op != EOpAssign)
        error(loc, "only simple assignment to non-simple matrix swizzle is supported", "assign", "");

    // isolate the matrix and swizzle nodes
    TIntermTyped* matrix = left->getAsBinaryNode()->getLeft()->getAsTyped();
    const TIntermSequence& swizzle = left->getAsBinaryNode()->getRight()->getAsAggregate()->getSequence();

    // if the RHS isn't already a simple vector, let's store into one
    TIntermSymbol* vector = right->getAsSymbolNode();
    TIntermTyped* vectorAssign = nullptr;
    if (vector == nullptr) {
        // create a new intermediate vector variable to assign to
        TType vectorType(matrix->getBasicType(), EvqTemporary, matrix->getQualifier().precision, (int)swizzle.size()/2);
        vector = intermediate.addSymbol(*makeInternalVariable("intermVec", vectorType), loc);

        // assign the right to the new vector
        vectorAssign = handleAssign(loc, op, vector, right);
    }

    // Assign the vector components to the matrix components.
    // Store this as a sequence, so a single aggregate node represents this
    // entire operation.
    TIntermAggregate* result = intermediate.makeAggregate(vectorAssign);
    TType columnType(matrix->getType(), 0);
    TType componentType(columnType, 0);
    TType indexType(EbtInt);
    for (int i = 0; i < (int)swizzle.size(); i += 2) {
        // the right component, single index into the RHS vector
        TIntermTyped* rightComp = intermediate.addIndex(EOpIndexDirect, vector,
                                    intermediate.addConstantUnion(i/2, loc), loc);

        // the left component, double index into the LHS matrix
        TIntermTyped* leftComp = intermediate.addIndex(EOpIndexDirect, matrix,
                                    intermediate.addConstantUnion(swizzle[i]->getAsConstantUnion()->getConstArray(),
                                                                  indexType, loc),
                                    loc);
        leftComp->setType(columnType);
        leftComp = intermediate.addIndex(EOpIndexDirect, leftComp,
                                    intermediate.addConstantUnion(swizzle[i+1]->getAsConstantUnion()->getConstArray(),
                                                                  indexType, loc),
                                    loc);
        leftComp->setType(componentType);

        // Add the assignment to the aggregate
        result = intermediate.growAggregate(result, intermediate.addAssign(op, leftComp, rightComp, loc));
    }

    result->setOp(EOpSequence);

    return result;
}